

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_Disasm.c
# Opt level: O0

void vex_GE(PDISASM pMyDisasm,int mem1,int mem2,int mem3,int reg1,int reg2,int reg3)

{
  Int32 IVar1;
  int reg2_local;
  int reg1_local;
  int mem3_local;
  int mem2_local;
  int mem1_local;
  PDISASM pMyDisasm_local;
  
  verifyVEXvvvv(pMyDisasm);
  if ((pMyDisasm->Reserved_).VEX.L == '\0') {
    IVar1 = 0x110000;
    if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
      IVar1 = 0x140000;
    }
    (pMyDisasm->Instruction).Category = IVar1;
    (pMyDisasm->Reserved_).Register_ = reg1;
    (pMyDisasm->Reserved_).MemDecoration = mem1;
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
    (pMyDisasm->Reserved_).Register_ = 4;
    decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Reserved_).EIP_ =
         (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
  }
  else if ((pMyDisasm->Reserved_).VEX.L == '\x01') {
    IVar1 = 0x120000;
    if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
      IVar1 = 0x140000;
    }
    (pMyDisasm->Instruction).Category = IVar1;
    (pMyDisasm->Reserved_).Register_ = reg2;
    (pMyDisasm->Reserved_).MemDecoration = mem2;
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
    (pMyDisasm->Reserved_).Register_ = 8;
    decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Reserved_).EIP_ =
         (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
  }
  else if ((pMyDisasm->Reserved_).EVEX.LL == '\x02') {
    (pMyDisasm->Instruction).Category = 0x140000;
    (pMyDisasm->Reserved_).Register_ = reg3;
    (pMyDisasm->Reserved_).MemDecoration = mem3;
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
    (pMyDisasm->Reserved_).Register_ = 0x10;
    decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Reserved_).EIP_ =
         (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
  }
  return;
}

Assistant:

void __bea_callspec__ vex_GE(PDISASM pMyDisasm, int mem1, int mem2, int mem3, int reg1, int reg2, int reg3)
{
  verifyVEXvvvv(pMyDisasm);
  if (GV.VEX.L == 0) {
    pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
    GV.Register_ = reg1;
    GV.MemDecoration = mem1;
    decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
    GV.Register_ = SSE_REG;
    decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
    GV.EIP_ += GV.DECALAGE_EIP+2;
  }
  else if (GV.VEX.L == 0x1) {
    pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX2_INSTRUCTION;
    GV.Register_ = reg2;
    GV.MemDecoration = mem2;
    decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
    GV.Register_ = AVX_REG;
    decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
    GV.EIP_ += GV.DECALAGE_EIP+2;
  }
  else if (GV.EVEX.LL == 0x2) {
    pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
    GV.Register_ = reg3;
    GV.MemDecoration = mem3;
    decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
    GV.Register_ = AVX512_REG;
    decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
    GV.EIP_ += GV.DECALAGE_EIP+2;
  }
}